

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O0

void mondesc_attacks(menulist *menu,permonst *pm)

{
  attack *paVar1;
  char *__src;
  int local_144;
  attack local_140;
  int i;
  attack alt_attk;
  attack mattk;
  int sum [6];
  char *tmp;
  char buf [256];
  permonst *pm_local;
  menulist *menu_local;
  
  buf._248_8_ = pm;
  memset(&tmp,0,0x100);
  strcpy((char *)&tmp,"Attacks: ");
  local_144 = 0;
  do {
    if (5 < local_144) {
LAB_0028625b:
      strcat((char *)&tmp,".");
      add_menutext_wrapped(menu,0x48,(char *)&tmp);
      return;
    }
    paVar1 = &alt_attk + local_144;
    paVar1->aatyp = '\x01';
    paVar1->adtyp = '\0';
    paVar1->damn = '\0';
    paVar1->damd = '\0';
    paVar1 = getmattk((permonst *)buf._248_8_,local_144,(int *)&alt_attk,&local_140);
    i = *(int *)paVar1;
    __src = mondesc_one_attack((attack *)&i,(permonst *)buf._248_8_);
    if (*__src == '\0') {
      if (local_144 == 0) {
        strcat((char *)&tmp,"none");
      }
      goto LAB_0028625b;
    }
    if (local_144 != 0) {
      strcat((char *)&tmp,", ");
    }
    strcat((char *)&tmp,__src);
    local_144 = local_144 + 1;
  } while( true );
}

Assistant:

static void mondesc_attacks(struct menulist *menu, const struct permonst *pm)
{
    char buf[BUFSZ] = "";
    const char *tmp;
    int sum[NATTK];
    struct attack mattk, alt_attk;
    int i;

    strcpy(buf, "Attacks: ");
    for (i = 0; i < NATTK; i++) {
	sum[i] = 1; /* show "stun" for e.g. Demogorgon */
	mattk = *getmattk(pm, i, sum, &alt_attk);
	tmp = mondesc_one_attack(&mattk, pm);
	if (!*tmp) {
	    if (!i) strcat(buf, "none");
	    break;
	}
	if (i) strcat(buf, ", ");
	strcat(buf, tmp);
    }
    strcat(buf, ".");

    add_menutext_wrapped(menu, MONDESC_MAX_WIDTH, buf);
}